

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O2

ostream * plot::ansi::detail::operator<<(ostream *stream,cursor_move *move)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(stream,"\x1b[");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if (move->direction < 4) {
    poVar1 = std::operator<<(stream,(char)move->direction + 'A');
    return poVar1;
  }
  return stream;
}

Assistant:

inline std::ostream& operator<<(std::ostream& stream, cursor_move const& move) {
            stream << u8"\x1b[" << move.count;

            switch (move.direction) {
                case cursor_direction::up:
                    return stream << 'A';
                case cursor_direction::down:
                    return stream << 'B';
                case cursor_direction::forward:
                    return stream << 'C';
                case cursor_direction::backward:
                    return stream << 'D';
            }

            return stream;
        }